

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdconnection.cc
# Opt level: O0

bdConnection * __thiscall
bdConnectManager::findExistingConnectionBySender
          (bdConnectManager *this,bdId *sender,bdId *src,bdId *dest)

{
  bdConnection *pbVar1;
  bdNodeId *destId;
  bdNodeId *srcId;
  bdNodeId *senderId;
  bdNodeId proxyId;
  bdId *dest_local;
  bdId *src_local;
  bdId *sender_local;
  bdConnectManager *this_local;
  
  proxyId.data._12_8_ = dest;
  determineProxyId(this,&sender->id,&src->id,&dest->id,(bdNodeId *)((long)&senderId + 4));
  pbVar1 = findExistingConnection(this,&src->id,(bdNodeId *)((long)&senderId + 4),&dest->id);
  return pbVar1;
}

Assistant:

bdConnection *bdConnectManager::findExistingConnectionBySender(bdId *sender, bdId *src, bdId *dest) {
	bdNodeId proxyId;
	bdNodeId *senderId = &(sender->id);
	bdNodeId *srcId = &(src->id);
	bdNodeId *destId = &(dest->id);
	determineProxyId(senderId, srcId, destId, &proxyId);

	return findExistingConnection(srcId, &proxyId, destId);
}